

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

void __thiscall
Refal2::CVariables::Set(CVariables *this,TVariableIndex variableIndex,TTableIndex tableIndex)

{
  CVariable *pCVar1;
  bool bVar2;
  CVariable *variable;
  TTableIndex tableIndex_local;
  TVariableIndex variableIndex_local;
  CVariables *this_local;
  
  bVar2 = IsValidVariableIndex(this,variableIndex);
  if (!bVar2) {
    __assert_fail("IsValidVariableIndex( variableIndex )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                  ,0x2e,"void Refal2::CVariables::Set(TVariableIndex, TTableIndex)");
  }
  pCVar1 = this->variables;
  if (pCVar1[variableIndex].position < pCVar1[variableIndex].topPosition) {
    allocVariablesValues(this);
    this->variablesValues[pCVar1[variableIndex].position] = tableIndex;
    pCVar1[variableIndex].position = pCVar1[variableIndex].position + 1;
  }
  return;
}

Assistant:

void CVariables::Set( TVariableIndex variableIndex, TTableIndex tableIndex )
{
	assert( IsValidVariableIndex( variableIndex ) );
	CVariable& variable = variables[variableIndex];
	if( variable.position < variable.topPosition ) {
		allocVariablesValues();
		variablesValues[variable.position] = tableIndex;
		variable.position++;
	}
}